

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

void __thiscall
GlobOpt::KillLiveFields(GlobOpt *this,StackSym *stackSym,BVSparse<Memory::JitArenaAllocator> *bv)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ObjectSymInfo *pOVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  Loop *pLVar6;
  PropertySym *pPVar7;
  
  if ((stackSym->field_0x1a & 1) != 0) {
    stackSym = StackSym::GetVarEquivSym(stackSym,this->func);
    if (stackSym == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x97,"(stackSym)","stackSym");
      if (!bVar2) {
LAB_004993ae:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      stackSym = (StackSym *)0x0;
    }
  }
  bVar2 = StackSym::HasObjectInfo(stackSym);
  if ((!bVar2) ||
     (((stackSym->field_0x18 & 1) != 0 && ((stackSym->field_5).m_instrDef != (Instr *)0x0)))) {
    return;
  }
  pOVar4 = StackSym::GetObjectInfo(stackSym);
  pPVar7 = pOVar4->m_propertySymList;
  if (pPVar7 != (PropertySym *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (pPVar7->m_stackSym != stackSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0xa6,"(propertySym->m_stackSym == stackSym)",
                           "propertySym->m_stackSym == stackSym");
        if (!bVar2) goto LAB_004993ae;
        *puVar3 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(bv,(pPVar7->super_Sym).m_id);
      pBVar5 = bv;
      if (this->prePassLoop == (Loop *)0x0) {
        do {
          pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)pBVar5->head;
          if (pBVar5 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00499392;
        } while (((Type *)&pBVar5->alloc)->word == 0);
      }
      else {
        for (pLVar6 = this->rootLoopPrePass; pLVar6 != (Loop *)0x0; pLVar6 = pLVar6->parent) {
          BVSparse<Memory::JitArenaAllocator>::Set(pLVar6->fieldKilled,(pPVar7->super_Sym).m_id);
        }
      }
      pPVar7 = pPVar7->m_nextInStackSymList;
    } while (pPVar7 != (PropertySym *)0x0);
  }
LAB_00499392:
  KillObjectType(this,stackSym,bv);
  return;
}

Assistant:

void
GlobOpt::KillLiveFields(StackSym * stackSym, BVSparse<JitArenaAllocator> * bv)
{
    if (stackSym->IsTypeSpec())
    {
        stackSym = stackSym->GetVarEquivSym(this->func);
    }
    Assert(stackSym);

    // If the sym has no objectSymInfo, it must not represent an object and, hence, has no type sym or
    // property syms to kill.
    if (!stackSym->HasObjectInfo() || stackSym->IsSingleDef())
    {
        return;
    }

    // Note that the m_writeGuardSym is killed here as well, because it is part of the
    // m_propertySymList of the object.
    ObjectSymInfo * objectSymInfo = stackSym->GetObjectInfo();
    PropertySym * propertySym = objectSymInfo->m_propertySymList;
    while (propertySym != nullptr)
    {
        Assert(propertySym->m_stackSym == stackSym);
        bv->Clear(propertySym->m_id);
        if (this->IsLoopPrePass())
        {
            for (Loop * loop = this->rootLoopPrePass; loop != nullptr; loop = loop->parent)
            {
                loop->fieldKilled->Set(propertySym->m_id);
            }
        }
        else if (bv->IsEmpty())
        {
            // shortcut
            break;
        }
        propertySym = propertySym->m_nextInStackSymList;
    }

    this->KillObjectType(stackSym, bv);
}